

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void __thiscall AWeapon::AttachToOwner(AWeapon *this,AActor *other)

{
  TObjPtr<AActor> *obj;
  APlayerPawn *pAVar1;
  bool bVar2;
  AActor *pAVar3;
  AAmmo *pAVar4;
  AWeapon *pAVar5;
  APlayerPawn *pAVar6;
  
  AInventory::AttachToOwner(&this->super_AInventory,other);
  obj = &(this->super_AInventory).Owner;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  pAVar4 = AddAmmo(this,pAVar3,(PClassActor *)this->AmmoType1,this->AmmoGive1);
  (this->Ammo1).field_0.p = pAVar4;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  pAVar4 = AddAmmo(this,pAVar3,(PClassActor *)this->AmmoType2,this->AmmoGive2);
  (this->Ammo2).field_0.p = pAVar4;
  pAVar5 = AddWeapon(this,this->SisterWeaponType);
  (this->SisterWeapon).field_0.p = pAVar5;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar3->player != (player_t *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    bVar2 = userinfo_t::GetNeverSwitch(&pAVar3->player->userinfo);
    if ((!bVar2) && (((this->super_AInventory).field_0x4dd & 0x10) == 0)) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar3->player->PendingWeapon = this;
    }
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar1 = pAVar3->player->mo;
    pAVar6 = (APlayerPawn *)
             GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    if (pAVar1 == pAVar6) {
      (*(StatusBar->super_DObject)._vptr_DObject[0x12])(StatusBar,this);
    }
  }
  this->GivenAsMorphWeapon = false;
  return;
}

Assistant:

void AWeapon::AttachToOwner (AActor *other)
{
	Super::AttachToOwner (other);

	Ammo1 = AddAmmo (Owner, AmmoType1, AmmoGive1);
	Ammo2 = AddAmmo (Owner, AmmoType2, AmmoGive2);
	SisterWeapon = AddWeapon (SisterWeaponType);
	if (Owner->player != NULL)
	{
		if (!Owner->player->userinfo.GetNeverSwitch() && !(WeaponFlags & WIF_NO_AUTO_SWITCH))
		{
			Owner->player->PendingWeapon = this;
		}
		if (Owner->player->mo == players[consoleplayer].camera)
		{
			StatusBar->ReceivedWeapon (this);
		}
	}
	GivenAsMorphWeapon = false; // will be set explicitly by morphing code
}